

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

Var __thiscall Minisat::SimpSolver::newVar(SimpSolver *this,bool sign,bool dvar)

{
  Var VVar1;
  Var v;
  char local_27 [3];
  Var local_24;
  int local_20 [2];
  
  VVar1 = Solver::newVar(&this->super_Solver,sign,dvar);
  local_27[2] = 0;
  local_24 = VVar1;
  vec<char>::push(&this->frozen,local_27 + 2);
  local_27[1] = 0;
  vec<char>::push(&this->eliminated,local_27 + 1);
  if (this->use_simplification == true) {
    local_20[1] = 0;
    vec<int>::push(&this->n_occ,local_20 + 1);
    local_20[0] = 0;
    vec<int>::push(&this->n_occ,local_20);
    OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::init
              (&this->occurs,(EVP_PKEY_CTX *)&local_24);
    local_27[0] = '\0';
    vec<char>::push(&this->touched,local_27);
    Heap<Minisat::SimpSolver::ElimLt>::insert(&this->elim_heap,local_24);
    VVar1 = local_24;
  }
  return VVar1;
}

Assistant:

Var SimpSolver::newVar(bool sign, bool dvar)
{
    Var v = Solver::newVar(sign, dvar);

    frozen.push((char)false);
    eliminated.push((char)false);

    if (use_simplification) {
        n_occ.push(0);
        n_occ.push(0);
        occurs.init(v);
        touched.push(0);
        elim_heap.insert(v);
    }

    // TODO: make sure to add new data structures also to reserveVars below!

    return v;
}